

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  CommandLine<Catch::ConfigData> *in_RDI;
  CommandLine<Catch::ConfigData> *cli;
  string *in_stack_fffffffffffff0b8;
  CommandLine<Catch::ConfigData> *in_stack_fffffffffffff0c0;
  allocator *paVar1;
  string *in_stack_fffffffffffff0e0;
  allocator *placeholder;
  _func_void_ConfigData_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_stack_fffffffffffff0e8;
  allocator *binaryFunction;
  CommandLine<Catch::ConfigData> *in_stack_fffffffffffff0f0;
  allocator *this;
  string *in_stack_fffffffffffff190;
  CommandLine<Catch::ConfigData> *in_stack_fffffffffffff198;
  CommandLine<Catch::ConfigData> *this_00;
  allocator local_bc1;
  string local_bc0 [39];
  allocator local_b99;
  string local_b98 [47];
  allocator local_b69;
  string local_b68 [39];
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [47];
  allocator local_ae9;
  string local_ae8 [39];
  allocator local_ac1;
  string local_ac0 [39];
  allocator local_a99;
  string local_a98 [47];
  allocator local_a69;
  string local_a68 [39];
  allocator local_a41;
  string local_a40 [47];
  allocator local_a11;
  string local_a10 [39];
  allocator local_9e9;
  string local_9e8 [47];
  allocator local_9b9;
  string local_9b8 [39];
  allocator local_991;
  string local_990 [39];
  allocator local_969;
  string local_968 [47];
  allocator local_939;
  string local_938 [39];
  allocator local_911;
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [47];
  undefined1 local_891 [40];
  allocator local_869;
  string local_868 [39];
  allocator local_841;
  string local_840 [39];
  allocator local_819;
  string local_818 [47];
  allocator local_7e9;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [40];
  Arg *local_798;
  allocator local_789;
  string local_788 [39];
  allocator local_761;
  string local_760 [39];
  allocator local_739;
  string local_738 [39];
  allocator local_711;
  string local_710 [47];
  allocator local_6e1;
  string local_6e0 [39];
  allocator local_6b9;
  string local_6b8 [39];
  allocator local_691;
  string local_690 [39];
  allocator local_669;
  string local_668 [47];
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [47];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [47];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [47];
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [47];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [47];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [47];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [47];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [47];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [47];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [63];
  undefined1 local_9;
  
  local_9 = 0;
  Clara::CommandLine<Catch::ConfigData>::CommandLine(in_stack_fffffffffffff0c0);
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<Catch::ConfigData,std::__cxx11::string>
            (in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"-?",&local_49);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"-h",&local_71);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"--help",&local_99);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"display usage information",&local_c1);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"-l",&local_f1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"--list-tests",&local_119);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"list all/matching test cases",&local_141);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"-t",&local_171);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"--list-tags",&local_199);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"list all/matching tags",&local_1c1);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"-s",&local_1f1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"--success",&local_219);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"include successful tests in output",&local_241);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"-b",&local_271);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"--break",&local_299);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"break into debugger on failure",&local_2c1);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"-e",&local_2f1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"--nothrow",&local_319);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"skip exception tests",&local_341);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"-i",&local_371);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"--invisibles",&local_399);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"show invisibles (tabs, newlines)",&local_3c1);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"-o",&local_3f1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"--out",&local_419);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"output filename",&local_441);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"filename",&local_469);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"-r",&local_499);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"--reporter",&local_4c1);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"reporter to use (defaults to console)",&local_4e9);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"name",&local_511);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,
             in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"-n",&local_541);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"--name",&local_569);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"suite name",&local_591);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"name",&local_5b9);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"-a",&local_5e9);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"--abort",&local_611);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"abort at first failure",&local_639);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (_func_void_ConfigData_ptr *)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"-x",&local_669);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"--abortx",&local_691);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b8,"abort after x failures",&local_6b9);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"no. failures",&local_6e1);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,int>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (_func_void_ConfigData_ptr_int *)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_710,"-w",&local_711);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_738,"--warn",&local_739);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,"enable warnings",&local_761);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_788,"warning name",&local_789);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,
             in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  local_798 = (Arg *)Clara::CommandLine<Catch::ConfigData>::operator[](in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"which test or tests to use",&local_7c1);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8,"test name, pattern or tags",&local_7e9);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,
             in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,"-d",&local_819);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"--durations",&local_841);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"show test durations",&local_869);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  this_00 = (CommandLine<Catch::ConfigData> *)local_891;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_891 + 1),"yes/no",(allocator *)this_00);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,bool>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (_func_void_ConfigData_ptr_bool *)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string((string *)(local_891 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_891);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  paVar1 = &local_8c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c0,"-f",paVar1);
  Clara::CommandLine<Catch::ConfigData>::operator[](this_00,(string *)paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"--input-file",&local_8e9);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_910,"load test names to run from a file",&local_911);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_938,"filename",&local_939);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,
             in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_968,"-#",&local_969);
  Clara::CommandLine<Catch::ConfigData>::operator[](this_00,(string *)paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_990,"--filenames-as-tags",&local_991);
  Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
            ((OptBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b8,"adds a tag for the filename",&local_9b9);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  std::__cxx11::string::~string(local_990);
  std::allocator<char>::~allocator((allocator<char> *)&local_991);
  std::__cxx11::string::~string(local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"--list-test-names-only",&local_9e9);
  Clara::CommandLine<Catch::ConfigData>::operator[](this_00,(string *)paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a10,"list all/matching test cases names only",&local_a11);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a40,"--list-reporters",&local_a41);
  Clara::CommandLine<Catch::ConfigData>::operator[](this_00,(string *)paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a68,"list all reporters",&local_a69);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)in_stack_fffffffffffff0f0,
             (offset_in_ConfigData_to_bool)in_stack_fffffffffffff0e8);
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a98,"--order",&local_a99);
  Clara::CommandLine<Catch::ConfigData>::operator[](this_00,(string *)paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac0,"test case order (defaults to decl)",&local_ac1);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  this = &local_ae9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae8,"decl|lex|rand",this);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)this,in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  std::__cxx11::string::~string(local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  binaryFunction = &local_b19;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b18,"--rng-seed",binaryFunction);
  Clara::CommandLine<Catch::ConfigData>::operator[](this_00,(string *)paVar1);
  placeholder = &local_b41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b40,"set a specific seed for random numbers",placeholder);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b68,"\'time\'|number",&local_b69);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)this,
             (_func_void_ConfigData_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)binaryFunction,(string *)placeholder);
  std::__cxx11::string::~string(local_b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_b69);
  std::__cxx11::string::~string(local_b40);
  std::allocator<char>::~allocator((allocator<char> *)&local_b41);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b98,"--force-colour",&local_b99);
  Clara::CommandLine<Catch::ConfigData>::operator[](this_00,(string *)paVar1);
  paVar1 = &local_bc1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc0,"force colourised output",paVar1);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
            ((ArgBuilder *)paVar1,in_stack_fffffffffffff0b8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)this,(offset_in_ConfigData_to_bool)binaryFunction);
  std::__cxx11::string::~string(local_bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  std::__cxx11::string::~string(local_b98);
  std::allocator<char>::~allocator((allocator<char> *)&local_b99);
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

        using namespace Clara;
        CommandLine<ConfigData> cli;

        cli.bindProcessName( &ConfigData::processName );

        cli["-?"]["-h"]["--help"]
            .describe( "display usage information" )
            .bind( &ConfigData::showHelp );

        cli["-l"]["--list-tests"]
            .describe( "list all/matching test cases" )
            .bind( &ConfigData::listTests );

        cli["-t"]["--list-tags"]
            .describe( "list all/matching tags" )
            .bind( &ConfigData::listTags );

        cli["-s"]["--success"]
            .describe( "include successful tests in output" )
            .bind( &ConfigData::showSuccessfulTests );

        cli["-b"]["--break"]
            .describe( "break into debugger on failure" )
            .bind( &ConfigData::shouldDebugBreak );

        cli["-e"]["--nothrow"]
            .describe( "skip exception tests" )
            .bind( &ConfigData::noThrow );

        cli["-i"]["--invisibles"]
            .describe( "show invisibles (tabs, newlines)" )
            .bind( &ConfigData::showInvisibles );

        cli["-o"]["--out"]
            .describe( "output filename" )
            .bind( &ConfigData::outputFilename, "filename" );

        cli["-r"]["--reporter"]
//            .placeholder( "name[:filename]" )
            .describe( "reporter to use (defaults to console)" )
            .bind( &addReporterName, "name" );

        cli["-n"]["--name"]
            .describe( "suite name" )
            .bind( &ConfigData::name, "name" );

        cli["-a"]["--abort"]
            .describe( "abort at first failure" )
            .bind( &abortAfterFirst );

        cli["-x"]["--abortx"]
            .describe( "abort after x failures" )
            .bind( &abortAfterX, "no. failures" );

        cli["-w"]["--warn"]
            .describe( "enable warnings" )
            .bind( &addWarning, "warning name" );

// - needs updating if reinstated
//        cli.into( &setVerbosity )
//            .describe( "level of verbosity (0=no output)" )
//            .shortOpt( "v")
//            .longOpt( "verbosity" )
//            .placeholder( "level" );

        cli[_]
            .describe( "which test or tests to use" )
            .bind( &addTestOrTags, "test name, pattern or tags" );

        cli["-d"]["--durations"]
            .describe( "show test durations" )
            .bind( &setShowDurations, "yes/no" );

        cli["-f"]["--input-file"]
            .describe( "load test names to run from a file" )
            .bind( &loadTestNamesFromFile, "filename" );

        cli["-#"]["--filenames-as-tags"]
            .describe( "adds a tag for the filename" )
            .bind( &ConfigData::filenamesAsTags );

        // Less common commands which don't have a short form
        cli["--list-test-names-only"]
            .describe( "list all/matching test cases names only" )
            .bind( &ConfigData::listTestNamesOnly );

        cli["--list-reporters"]
            .describe( "list all reporters" )
            .bind( &ConfigData::listReporters );

        cli["--order"]
            .describe( "test case order (defaults to decl)" )
            .bind( &setOrder, "decl|lex|rand" );

        cli["--rng-seed"]
            .describe( "set a specific seed for random numbers" )
            .bind( &setRngSeed, "'time'|number" );

        cli["--force-colour"]
            .describe( "force colourised output" )
            .bind( &ConfigData::forceColour );

        return cli;
    }